

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetCustomCommands
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data,string *config)

{
  pointer *pppcVar1;
  pointer pSVar2;
  iterator __position;
  KindedSources *pKVar3;
  SourceAndKind *s;
  pointer __args;
  
  pKVar3 = GetKindedSources(this,config);
  pSVar2 = (pKVar3->Sources).
           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (pKVar3->Sources).
                super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != pSVar2; __args = __args + 1) {
    if (__args->Kind == SourceKindCustomCommand) {
      __position._M_current =
           (data->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>::
        _M_realloc_insert<cmSourceFile_const*const&>
                  ((vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>> *)data,
                   __position,(cmSourceFile **)__args);
      }
      else {
        *__position._M_current = (__args->Source).Value;
        pppcVar1 = &(data->
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetCustomCommands(
  std::vector<cmSourceFile const*>& data, const std::string& config) const
{
  IMPLEMENT_VISIT(SourceKindCustomCommand);
}